

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O0

void uc_init_x86_64(uc_struct *uc)

{
  uc_struct *uc_local;
  
  uc->reg_read = reg_read_x86_64;
  uc->reg_write = reg_write_x86_64;
  uc->reg_reset = reg_reset;
  uc->release = x86_release;
  uc->set_pc = x86_set_pc;
  uc->get_pc = x86_get_pc;
  uc->stop_interrupt = x86_stop_interrupt;
  uc->insn_hook_validate = x86_insn_hook_validate;
  uc->opcode_hook_invalidate = x86_opcode_hook_invalidate;
  uc->cpus_init = x86_cpus_init;
  uc->cpu_context_size = 0x1598;
  uc_common_init(uc);
  return;
}

Assistant:

DEFAULT_VISIBILITY
void uc_init(struct uc_struct *uc)
{
    uc->reg_read = reg_read;
    uc->reg_write = reg_write;
    uc->reg_reset = reg_reset;
    uc->release = x86_release;
    uc->set_pc = x86_set_pc;
    uc->get_pc = x86_get_pc;
    uc->stop_interrupt = x86_stop_interrupt;
    uc->insn_hook_validate = x86_insn_hook_validate;
    uc->opcode_hook_invalidate = x86_opcode_hook_invalidate;
    uc->cpus_init = x86_cpus_init;
    uc->cpu_context_size = offsetof(CPUX86State, retaddr);
    uc_common_init(uc);
}